

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_const_suite::random_access_iterator_addition_assignment(void)

{
  initializer_list<int> __l;
  iterator begin;
  iterator end;
  size_type length;
  undefined4 local_dc;
  view_pointer local_d8;
  view_pointer pcStack_d0;
  const_iterator local_c0;
  difference_type local_b0 [2];
  undefined1 auStack_a0 [8];
  const_iterator a;
  circular_view<int,18446744073709551615ul> local_78 [8];
  circular_view<int,_18446744073709551615UL> span;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  local_40[2] = 0x21;
  local_40[3] = 0x2c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  begin = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20);
  a.current = (size_type)
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  length = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_20);
  vista::circular_view<int,18446744073709551615ul>::
  circular_view<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_78,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)a.current,length);
  _auStack_a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                          ((circular_view<int,_18446744073709551615UL> *)local_78);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator+=
            ((basic_iterator<const_int> *)auStack_a0,2);
  local_c0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_d8 = (view_pointer)auStack_a0;
  pcStack_d0 = a.parent;
  local_b0[0] = std::
                distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>>
                          (local_c0,_auStack_a0);
  local_dc = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x1d9,"void concept_const_suite::random_access_iterator_addition_assignment()",
             local_b0,&local_dc);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void random_access_iterator_addition_assignment()
{
    // r += n
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.begin();
    a += 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
}